

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_do_button_text_image
              (nk_flags *state,nk_command_buffer *out,nk_rect bounds,nk_image img,char *str,int len,
              nk_flags align,nk_button_behavior behavior,nk_style_button *style,nk_user_font *font,
              nk_input *in)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float local_7c;
  undefined1 local_70 [8];
  nk_rect content;
  nk_rect icon;
  int ret;
  nk_button_behavior behavior_local;
  nk_flags align_local;
  int len_local;
  char *str_local;
  nk_command_buffer *out_local;
  nk_flags *state_local;
  float fStack_20;
  nk_rect bounds_local;
  
  state_local._4_4_ = bounds.x;
  fStack_20 = bounds.y;
  bounds_local.x = bounds.w;
  bounds_local.y = bounds.h;
  if (style == (nk_style_button *)0x0) {
    __assert_fail("style",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x4d68,
                  "int nk_do_button_text_image(nk_flags *, struct nk_command_buffer *, struct nk_rect, struct nk_image, const char *, int, nk_flags, enum nk_button_behavior, const struct nk_style_button *, const struct nk_user_font *, const struct nk_input *)"
                 );
  }
  if (state == (nk_flags *)0x0) {
    __assert_fail("state",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x4d69,
                  "int nk_do_button_text_image(nk_flags *, struct nk_command_buffer *, struct nk_rect, struct nk_image, const char *, int, nk_flags, enum nk_button_behavior, const struct nk_style_button *, const struct nk_user_font *, const struct nk_input *)"
                 );
  }
  if (font == (nk_user_font *)0x0) {
    __assert_fail("font",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x4d6a,
                  "int nk_do_button_text_image(nk_flags *, struct nk_command_buffer *, struct nk_rect, struct nk_image, const char *, int, nk_flags, enum nk_button_behavior, const struct nk_style_button *, const struct nk_user_font *, const struct nk_input *)"
                 );
  }
  if (out == (nk_command_buffer *)0x0) {
    __assert_fail("out",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x4d6b,
                  "int nk_do_button_text_image(nk_flags *, struct nk_command_buffer *, struct nk_rect, struct nk_image, const char *, int, nk_flags, enum nk_button_behavior, const struct nk_style_button *, const struct nk_user_font *, const struct nk_input *)"
                 );
  }
  if ((((out == (nk_command_buffer *)0x0) || (font == (nk_user_font *)0x0)) ||
      (style == (nk_style_button *)0x0)) || (str == (char *)0x0)) {
    bounds_local.w = 0.0;
  }
  else {
    fVar3 = (float)nk_do_button(state,out,bounds,style,in,behavior,(nk_rect *)local_70);
    fVar1 = (style->padding).y;
    if ((align & 1) == 0) {
      fVar1 = (style->padding).x;
      content.w = fVar1 + fVar1 + state_local._4_4_;
    }
    else {
      fVar2 = (style->padding).x;
      local_7c = (state_local._4_4_ + bounds_local.x) -
                 (fVar2 + fVar2 + (bounds_local.y - (fVar1 + fVar1)));
      if (local_7c < 0.0) {
        local_7c = 0.0;
      }
      content.w = local_7c;
    }
    content.w = (style->image_padding).x + content.w;
    content.h = (style->image_padding).y + fStack_20 + (style->padding).y;
    if (style->draw_begin != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
      (*style->draw_begin)(out,(nk_handle)(style->userdata).ptr);
    }
    nk_draw_button_text_image
              (out,(nk_rect *)((long)&state_local + 4),(nk_rect *)local_70,(nk_rect *)&content.w,
               *state,style,str,len,font,&img);
    bounds_local.w = fVar3;
    if (style->draw_end != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
      (*style->draw_end)(out,(nk_handle)(style->userdata).ptr);
    }
  }
  return (int)bounds_local.w;
}

Assistant:

NK_LIB int
nk_do_button_text_image(nk_flags *state,
    struct nk_command_buffer *out, struct nk_rect bounds,
    struct nk_image img, const char* str, int len, nk_flags align,
    enum nk_button_behavior behavior, const struct nk_style_button *style,
    const struct nk_user_font *font, const struct nk_input *in)
{
    int ret;
    struct nk_rect icon;
    struct nk_rect content;

    NK_ASSERT(style);
    NK_ASSERT(state);
    NK_ASSERT(font);
    NK_ASSERT(out);
    if (!out || !font || !style || !str)
        return nk_false;

    ret = nk_do_button(state, out, bounds, style, in, behavior, &content);
    icon.y = bounds.y + style->padding.y;
    icon.w = icon.h = bounds.h - 2 * style->padding.y;
    if (align & NK_TEXT_ALIGN_LEFT) {
        icon.x = (bounds.x + bounds.w) - (2 * style->padding.x + icon.w);
        icon.x = NK_MAX(icon.x, 0);
    } else icon.x = bounds.x + 2 * style->padding.x;

    icon.x += style->image_padding.x;
    icon.y += style->image_padding.y;
    icon.w -= 2 * style->image_padding.x;
    icon.h -= 2 * style->image_padding.y;

    if (style->draw_begin) style->draw_begin(out, style->userdata);
    nk_draw_button_text_image(out, &bounds, &content, &icon, *state, style, str, len, font, &img);
    if (style->draw_end) style->draw_end(out, style->userdata);
    return ret;
}